

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 this_00;
  XmlWriter *this_01;
  undefined1 local_c0 [16];
  pointer local_b0 [2];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testRunStats);
  local_b0[0] = (pointer)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"OverallResults","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_c0,(string *)this_01,(XmlFormatting)local_b0);
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"successes","");
  this_00 = local_c0._0_8_;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c0._0_8_,&local_50,&(testRunStats->totals).assertions.passed);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,&local_70,&(testRunStats->totals).assertions.failed);
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"expectedFailures","")
  ;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)(local_a0 + 0x10),
             &(testRunStats->totals).assertions.failedButOk);
  if ((undefined1 *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c0);
  if (local_b0[0] != (pointer)local_a0) {
    operator_delete(local_b0[0]);
  }
  local_b0[0] = (pointer)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"OverallResultsCases","");
  XmlWriter::scopedElement((XmlWriter *)local_c0,(string *)this_01,(XmlFormatting)local_b0);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"successes","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c0._0_8_,&local_50,&(testRunStats->totals).testCases.passed);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c0._0_8_,&local_70,&(testRunStats->totals).testCases.failed);
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"expectedFailures","")
  ;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c0._0_8_,(string *)(local_a0 + 0x10),
             &(testRunStats->totals).testCases.failedButOk);
  if ((undefined1 *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c0);
  if (local_b0[0] != (pointer)local_a0) {
    operator_delete(local_b0[0]);
  }
  XmlWriter::endElement(this_01,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }